

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O0

void do_alist(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  char *in_RSI;
  char *amatch;
  char *nmatch;
  int vmatch;
  AREA_DATA_conflict *pArea;
  char result [9216];
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffc9a8;
  undefined8 uVar3;
  char *ch_00;
  undefined4 in_stack_ffffffffffffc9c0;
  int in_stack_ffffffffffffc9c4;
  char *local_3638;
  char *local_3630;
  int local_3624;
  AREA_DATA_conflict *local_3620;
  char local_3618 [9216];
  char local_1218 [4616];
  char *local_10;
  
  local_3624 = 0;
  local_3630 = (char *)0x0;
  local_10 = in_RSI;
  bVar1 = is_number((char *)in_stack_ffffffffffffc9a8);
  if (bVar1) {
    local_3624 = atoi(local_10);
  }
  else if (*local_10 != '\0') {
    local_3630 = local_10;
  }
  bVar1 = check_security(in_stack_ffffffffffffc9a8);
  if (bVar1) {
    uVar3 = 0;
    ch_00 = "Builders";
    sprintf(local_3618,"[%3s] [%-27s] (%-5s-%5s) [%-10s] %3s [%-10s]\n\r","Num","Area Name","lvnum",
            "uvnum","Filename","Sec");
    if (local_3630 != (char *)0x0) {
      for (local_3638 = local_3630; *local_3638 != '\0'; local_3638 = local_3638 + 1) {
        if ((*local_3638 < 'A') || ('Z' < *local_3638)) {
          in_stack_ffffffffffffc9c4 = (int)*local_3638;
        }
        else {
          in_stack_ffffffffffffc9c4 = *local_3638 + 0x20;
        }
        *local_3638 = (char)in_stack_ffffffffffffc9c4;
      }
    }
    for (local_3620 = area_first; local_3620 != (AREA_DATA_conflict *)0x0;
        local_3620 = local_3620->next) {
      if (local_3630 == (char *)0x0) {
LAB_007712fc:
        if ((local_3624 == 0) ||
           ((local_3620->min_vnum <= local_3624 && (local_3624 <= local_3620->max_vnum)))) {
          ch_00 = local_3620->credits;
          uVar3 = CONCAT44((int)((ulong)uVar3 >> 0x20),local_3620->security);
          sprintf(local_1218,"[%3d] %-29.29s (%-5d-%5d) %-12.12s [%d] [%-10.10s]\n\r",
                  (ulong)(uint)local_3620->vnum,local_3620->name,
                  (ulong)(uint)(int)local_3620->min_vnum,(ulong)(uint)(int)local_3620->max_vnum,
                  local_3620->file_name,uVar3);
          strcat(local_3618,local_1218);
        }
      }
      else {
        pcVar2 = lowstring(local_3620->name);
        pcVar2 = strstr(pcVar2,local_3630);
        if (pcVar2 != (char *)0x0) goto LAB_007712fc;
      }
    }
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffc9c4,in_stack_ffffffffffffc9c0),
                 (CHAR_DATA *)ch_00);
  }
  return;
}

Assistant:

void do_alist(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char result[MAX_STRING_LENGTH * 2]; /* May need tweaking. */
	AREA_DATA *pArea;
	int vmatch = 0;
	char *nmatch = nullptr, *amatch = nullptr;

	if (is_number(argument))
		vmatch = atoi(argument);
	else if (argument[0] != '\0')
		nmatch = argument;

	if (!check_security(ch))
		return;

	sprintf(result, "[%3s] [%-27s] (%-5s-%5s) [%-10s] %3s [%-10s]\n\r", "Num", "Area Name", "lvnum", "uvnum", "Filename", "Sec", "Builders");

	if (nmatch)
	{
		for (amatch = nmatch; *amatch; amatch++)
		{
			*amatch = LOWER(*amatch);
		}
	}

	for (pArea = area_first; pArea; pArea = pArea->next)
	{
		if (nmatch != nullptr && !strstr(lowstring(pArea->name), nmatch))
			continue;
		else if (vmatch && (pArea->min_vnum > vmatch || pArea->max_vnum < vmatch))
			continue;

		sprintf(buf, "[%3d] %-29.29s (%-5d-%5d) %-12.12s [%d] [%-10.10s]\n\r",
			pArea->vnum,
			pArea->name,
			pArea->min_vnum,
			pArea->max_vnum,
			pArea->file_name,
			pArea->security,
			pArea->credits);

		strcat(result, buf);
	}

	send_to_char(result, ch);
}